

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O3

void __thiscall
webrtc::PushSincResampler::PushSincResampler
          (PushSincResampler *this,size_t source_frames,size_t destination_frames)

{
  SincResampler *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  (this->super_SincResamplerCallback)._vptr_SincResamplerCallback =
       (_func_int **)&PTR__PushSincResampler_001d0d70;
  this_00 = (SincResampler *)operator_new(0x88);
  auVar1._8_4_ = (int)(source_frames >> 0x20);
  auVar1._0_8_ = source_frames;
  auVar1._12_4_ = 0x45300000;
  auVar2._8_4_ = (int)(destination_frames >> 0x20);
  auVar2._0_8_ = destination_frames;
  auVar2._12_4_ = 0x45300000;
  SincResampler::SincResampler
            (this_00,((auVar1._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)source_frames) - 4503599627370496.0)) /
                     ((auVar2._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)destination_frames) - 4503599627370496.0)),
             source_frames,&this->super_SincResamplerCallback);
  (this->resampler_)._M_t.
  super___uniq_ptr_impl<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::SincResampler_*,_std::default_delete<webrtc::SincResampler>_>.
  super__Head_base<0UL,_webrtc::SincResampler_*,_false>._M_head_impl = this_00;
  (this->float_buffer_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
  this->source_ptr_ = (float *)0x0;
  this->source_ptr_int_ = (int16_t *)0x0;
  this->destination_frames_ = destination_frames;
  this->first_pass_ = true;
  this->source_available_ = 0;
  return;
}

Assistant:

PushSincResampler::PushSincResampler(size_t source_frames,
                                     size_t destination_frames)
    : resampler_(new SincResampler(source_frames * 1.0 / destination_frames,
                                   source_frames,
                                   this)),
      source_ptr_(nullptr),
      source_ptr_int_(nullptr),
      destination_frames_(destination_frames),
      first_pass_(true),
      source_available_(0) {}